

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

WasmOp __thiscall Wasm::WasmBinaryReader::ReadOpCode(WasmBinaryReader *this)

{
  uint32 *puVar1;
  byte bVar2;
  byte *pbVar3;
  bool isSupported;
  WasmOp WVar4;
  char16_t *notSupportedMsg;
  
  pbVar3 = this->m_pc;
  if (*(int *)&this->m_end == (int)pbVar3) {
    ThrowDecodingError(this,L"Out of file: Needed: %d, Left: %d",1);
  }
  this->m_pc = pbVar3 + 1;
  bVar2 = *pbVar3;
  puVar1 = &(this->m_funcState).count;
  *puVar1 = *puVar1 + 1;
  if (bVar2 < 0xfd) {
    if (bVar2 != 0xfc) {
      if (bVar2 == 0xf0) {
        ThrowDecodingError(this,L"Tracing opcodes not allowed");
      }
LAB_00f29b3a:
      return (WasmOp)bVar2;
    }
    isSupported = WasmNontrapping::IsEnabled();
    notSupportedMsg = L"WebAssembly nontrapping float-to-int conversion support is not enabled";
  }
  else if (bVar2 == 0xfd) {
    isSupported = Simd::IsEnabled();
    notSupportedMsg = L"WebAssembly Simd support is not enabled";
  }
  else {
    if (bVar2 != 0xfe) goto LAB_00f29b3a;
    isSupported = Threads::IsEnabled();
    notSupportedMsg = L"WebAssembly Threads support is not enabled";
  }
  WVar4 = ReadPrefixedOpCode(this,(ushort)bVar2,isSupported,notSupportedMsg);
  return WVar4;
}

Assistant:

WasmOp WasmBinaryReader::ReadOpCode()
{
    CheckBytesLeft(1);
    WasmOp op = (WasmOp)*m_pc++;
    ++m_funcState.count;

    switch (op)
    {
#define WASM_PREFIX(name, value, imp, errorMsg) \
    case prefix##name: \
        return ReadPrefixedOpCode(op, imp, _u(errorMsg));
#include "WasmBinaryOpCodes.h"
    }

    return op;
}